

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<unsigned_int> __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_int>::tryAllocate
          (HoleSet<unsigned_int> *this,uint lgSize)

{
  uint uVar1;
  uint result;
  undefined8 in_RAX;
  uint in_EDX;
  undefined4 in_register_00000034;
  long lVar2;
  ulong uVar3;
  char local_28 [4];
  uint local_24;
  
  lVar2 = CONCAT44(in_register_00000034,lgSize);
  if (in_EDX < 6) {
    uVar3 = (ulong)in_EDX;
    uVar1 = *(uint *)(lVar2 + uVar3 * 4);
    if (uVar1 == 0) {
      _local_28 = in_RAX;
      tryAllocate((HoleSet<unsigned_int> *)local_28,lgSize);
      if (local_28[0] == '\x01') {
        *(uint *)(lVar2 + uVar3 * 4) = local_24 * 2 + 1;
        this->holes[1] = local_24 * 2;
      }
      *(bool *)this->holes = local_28[0] == '\x01';
    }
    else {
      *(undefined4 *)(lVar2 + uVar3 * 4) = 0;
      *(undefined1 *)this->holes = 1;
      this->holes[1] = uVar1;
    }
  }
  else {
    *(undefined1 *)this->holes = 0;
  }
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

kj::Maybe<UIntType> tryAllocate(UIntType lgSize) {
      // Try to find space for a field of size 2^lgSize within the set of holes.  If found,
      // remove it from the holes, and return its offset (as a multiple of its size).  If there
      // is no such space, returns zero (no hole can be at offset zero, as explained above).

      if (lgSize >= kj::size(holes)) {
        return nullptr;
      } else if (holes[lgSize] != 0) {
        UIntType result = holes[lgSize];
        holes[lgSize] = 0;
        return result;
      } else {
        KJ_IF_MAYBE(next, tryAllocate(lgSize + 1)) {
          UIntType result = *next * 2;
          holes[lgSize] = result + 1;
          return result;
        } else {
          return nullptr;
        }
      }
    }